

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Resize
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,map_index_t new_num_buckets)

{
  uint n;
  uint uVar1;
  TableEntryPtr entry;
  map_index_t mVar2;
  TableEntryPtr *pTVar3;
  string *psVar4;
  TableEntryPtr *pTVar5;
  NodeBase *node;
  TreeForMap *tree;
  map_index_t i;
  ulong uVar6;
  anon_enum_32 local_44;
  map_index_t local_40 [4];
  
  if ((this->super_UntypedMapBase).num_buckets_ == 1) {
    (this->super_UntypedMapBase).index_of_first_non_null_ = 2;
    (this->super_UntypedMapBase).num_buckets_ = 2;
    pTVar3 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,2);
    (this->super_UntypedMapBase).table_ = pTVar3;
    mVar2 = UntypedMapBase::Seed(&this->super_UntypedMapBase);
    (this->super_UntypedMapBase).seed_ = mVar2;
  }
  else {
    local_44 = kMinTableSize;
    local_40[0] = new_num_buckets;
    psVar4 = absl::lts_20240722::log_internal::
             Check_GEImpl<unsigned_int,google::protobuf::internal::UntypedMapBase::_unnamed_type_1_>
                       (local_40,&local_44,"new_num_buckets >= kMinTableSize");
    if (psVar4 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x44a,psVar4->_M_string_length,(psVar4->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    pTVar3 = (this->super_UntypedMapBase).table_;
    n = (this->super_UntypedMapBase).num_buckets_;
    (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
    pTVar5 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
    (this->super_UntypedMapBase).table_ = pTVar5;
    uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
    (this->super_UntypedMapBase).index_of_first_non_null_ =
         (this->super_UntypedMapBase).num_buckets_;
    for (uVar6 = (ulong)uVar1; uVar6 < n; uVar6 = uVar6 + 1) {
      entry = pTVar3[uVar6];
      if ((entry & 1) == 0 && entry != 0) {
        node = TableEntryToNode(entry);
        TransferList(this,(KeyNode *)node);
      }
      else if ((entry & 1) != 0) {
        tree = TableEntryToTree(entry);
        UntypedMapBase::TransferTree(&this->super_UntypedMapBase,tree,NodeToVariantKey);
      }
    }
    UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,pTVar3,n);
  }
  return;
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = kMinTableSize;
      table_ = CreateEmptyTable(num_buckets_);
      seed_ = Seed();
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      if (internal::TableEntryIsNonEmptyList(old_table[i])) {
        TransferList(static_cast<KeyNode*>(TableEntryToNode(old_table[i])));
      } else if (internal::TableEntryIsTree(old_table[i])) {
        this->TransferTree(TableEntryToTree(old_table[i]), NodeToVariantKey);
      }
    }
    DeleteTable(old_table, old_table_size);
  }